

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O2

DetectorResult *
ZXing::QRCode::DetectPureQR(DetectorResult *__return_storage_ptr__,BitMatrix *image)

{
  PointT<int> PVar1;
  double dVar2;
  ConcentricPattern a;
  ConcentricPattern b;
  DetectorResult *pDVar3;
  ulong uVar4;
  int width_00;
  bool bVar5;
  unsigned_short uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  PointI size;
  float fVar10;
  float fVar11;
  PointT<double> p;
  int top;
  int left;
  int width;
  ulong local_f0;
  ulong local_e8;
  DetectorResult *local_e0;
  int height;
  _Type local_d0;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  double dStack_a8;
  uint local_a0;
  undefined4 uStack_9c;
  double local_98;
  double dStack_90;
  uint local_88;
  undefined4 uStack_84;
  BitMatrix local_80;
  undefined8 local_60;
  undefined8 local_58;
  PatternView local_50;
  
  bVar5 = BitMatrix::findBoundingBox(image,&left,&top,&width,&height,0x15);
  local_e0 = __return_storage_ptr__;
  if (bVar5) {
    uVar7 = width - height;
    uVar8 = -uVar7;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
    if (uVar8 < 2) {
      local_f0 = (ulong)(uint)left;
      uVar8 = (width + left) - 1;
      local_b8 = (ulong)uVar8;
      local_e8 = (ulong)(uint)top;
      uVar7 = (height + top) - 1;
      local_80._height = top;
      local_80._width = left;
      local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x100000001;
      local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(top,uVar8);
      local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1ffffffff;
      local_c0 = (ulong)uVar7 << 0x20;
      local_60 = CONCAT44(uVar7,left);
      local_58 = 0xffffffff00000001;
      lVar9 = 0;
      do {
        if (lVar9 == 0x30) {
          uVar6 = Reduce<std::array<unsigned_short,5ul>,unsigned_short,std::plus<unsigned_short>>
                            (local_d0,0);
          uVar4 = local_b8;
          local_88 = (uint)uVar6;
          local_b0 = (double)(uVar6 >> 1);
          local_98 = (double)(int)(float)local_f0 + local_b0;
          dStack_a8 = (double)(int)(float)local_e8 + local_b0;
          local_b0 = (double)(int)local_b8 - local_b0;
          local_a0 = (uint)uVar6;
          b._20_4_ = uStack_9c;
          b.size = local_a0;
          a._20_4_ = uStack_84;
          a.size = local_88;
          a.super_PointF.y = dStack_a8;
          a.super_PointF.x = local_98;
          b.super_PointF.y = dStack_a8;
          b.super_PointF.x = local_b0;
          dStack_90 = dStack_a8;
          EstimateDimension((DimensionEstimate *)&local_80,image,a,b);
          width_00 = local_80._width;
          size.y = local_80._width;
          size.x = local_80._width;
          local_f0._0_4_ = (float)width;
          bVar5 = Version::IsValidSize(size,Model2);
          if (bVar5) {
            local_f0._0_4_ = (float)local_f0 / (float)width_00;
            fVar11 = (float)local_f0 * 0.5;
            fVar10 = (float)(width_00 + -1) * (float)local_f0;
            local_e8 = CONCAT44(local_e8._4_4_,fVar11);
            p.y = (double)((float)top + fVar11 + fVar10);
            p.x = (double)((float)left + fVar11 + fVar10);
            bVar5 = BitMatrix::isIn<double>(image,p,0);
            if (bVar5) {
              Deflate(&local_80,image,width_00,width_00,(float)top + (float)local_e8,
                      (float)left + (float)local_e8,(float)local_f0);
              pDVar3 = local_e0;
              PVar1.y = top;
              PVar1.x = left;
              (local_e0->_bits)._width = local_80._width;
              (local_e0->_bits)._height = local_80._height;
              (local_e0->_bits)._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              (local_e0->_bits)._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              (local_e0->_bits)._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_80._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar1;
              (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
                   (PointT<int>)((ulong)(uint)top << 0x20 | uVar4);
              (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
                   (PointT<int>)(uVar4 | local_c0);
              (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
                   (PointT<int>)(local_c0 | (uint)left);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_80._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
              return pDVar3;
            }
          }
          break;
        }
        local_50._data = (Iterator)image;
        local_50._8_8_ = *(undefined8 *)((long)&local_80._width + lVar9);
        local_50._base =
             *(Iterator *)
              ((long)&local_80._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar9);
        local_d0 = (_Type)BitMatrixCursor<ZXing::PointT<int>>::
                          readPatternFromBlack<std::array<unsigned_short,5ul>>
                                    ((BitMatrixCursor<ZXing::PointT<int>> *)&local_50,1,
                                     width / 3 + 1);
        local_50._size = 5;
        local_50._base = (Iterator)0x0;
        local_50._end = (Iterator)0x0;
        local_50._data = local_d0;
        dVar2 = IsPattern<false,5,7>(&local_50,(FixedPattern<5,_7,_false> *)PATTERN,0,0.0,0.0);
        lVar9 = lVar9 + 0x10;
      } while ((dVar2 != 0.0) || (NAN(dVar2)));
    }
  }
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (local_e0->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (local_e0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_e0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_e0->_bits)._width = 0;
  (local_e0->_bits)._height = 0;
  (local_e0->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return local_e0;
}

Assistant:

DetectorResult DetectPureQR(const BitMatrix& image)
{
	using Pattern = std::array<PatternView::value_type, PATTERN.size()>;

#ifdef PRINT_DEBUG
	SaveAsPBM(image, "weg.pbm");
#endif

	constexpr int MIN_MODULES = Version::SymbolSize(1, Type::Model2).x;

	int left, top, width, height;
	if (!image.findBoundingBox(left, top, width, height, MIN_MODULES) || std::abs(width - height) > 1)
		return {};
	int right  = left + width - 1;
	int bottom = top + height - 1;

	PointI tl{left, top}, tr{right, top}, bl{left, bottom};
	Pattern diagonal;
	// allow corners be moved one pixel inside to accommodate for possible aliasing artifacts
	for (auto [p, d] : {std::pair(tl, PointI{1, 1}), {tr, {-1, 1}}, {bl, {1, -1}}}) {
		diagonal = BitMatrixCursorI(image, p, d).readPatternFromBlack<Pattern>(1, width / 3 + 1);
		if (!IsPattern(diagonal, PATTERN))
			return {};
	}

	auto fpWidth = Reduce(diagonal);
	auto dimension =
		EstimateDimension(image, {tl + fpWidth / 2 * PointF(1, 1), fpWidth}, {tr + fpWidth / 2 * PointF(-1, 1), fpWidth}).dim;

	float moduleSize = float(width) / dimension;
	if (!Version::IsValidSize({dimension, dimension}, Type::Model2) ||
		!image.isIn(PointF{left + moduleSize / 2 + (dimension - 1) * moduleSize,
						   top + moduleSize / 2 + (dimension - 1) * moduleSize}))
		return {};

#ifdef PRINT_DEBUG
	LogMatrix log;
	LogMatrixWriter lmw(log, image, 5, "grid2.pnm");
	for (int y = 0; y < dimension; y++)
		for (int x = 0; x < dimension; x++)
			log(PointF(left + (x + .5f) * moduleSize, top + (y + .5f) * moduleSize));
#endif

	// Now just read off the bits (this is a crop + subsample)
	return {Deflate(image, dimension, dimension, top + moduleSize / 2, left + moduleSize / 2, moduleSize),
			{{left, top}, {right, top}, {right, bottom}, {left, bottom}}};
}